

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectbox.hpp
# Opt level: O0

bool obx::anon_unknown_3::CollectingVisitorUniquePtr<objectbox::tsdemo::SensorValues>::visit
               (void *data,size_t size,void *userData)

{
  void *pvVar1;
  size_t data_00;
  unique_ptr<objectbox::tsdemo::SensorValues,_std::default_delete<objectbox::tsdemo::SensorValues>_>
  *__s;
  reference this;
  type outObject;
  unique_ptr<objectbox::tsdemo::SensorValues,_std::default_delete<objectbox::tsdemo::SensorValues>_>
  *ptrRef;
  vector<std::unique_ptr<objectbox::tsdemo::SensorValues,_std::default_delete<objectbox::tsdemo::SensorValues>_>,_std::allocator<std::unique_ptr<objectbox::tsdemo::SensorValues,_std::default_delete<objectbox::tsdemo::SensorValues>_>_>_>
  *local_28;
  CollectingVisitorUniquePtr<objectbox::tsdemo::SensorValues> *self;
  void *userData_local;
  size_t size_local;
  void *data_local;
  
  local_28 = (vector<std::unique_ptr<objectbox::tsdemo::SensorValues,_std::default_delete<objectbox::tsdemo::SensorValues>_>,_std::allocator<std::unique_ptr<objectbox::tsdemo::SensorValues,_std::default_delete<objectbox::tsdemo::SensorValues>_>_>_>
              *)userData;
  self = (CollectingVisitorUniquePtr<objectbox::tsdemo::SensorValues> *)userData;
  userData_local = (void *)size;
  size_local = (size_t)data;
  if (userData != (void *)0x0) {
    __s = (unique_ptr<objectbox::tsdemo::SensorValues,_std::default_delete<objectbox::tsdemo::SensorValues>_>
           *)operator_new(0x48);
    memset(__s,0,0x48);
    ptrRef = __s;
    std::
    vector<std::unique_ptr<objectbox::tsdemo::SensorValues,std::default_delete<objectbox::tsdemo::SensorValues>>,std::allocator<std::unique_ptr<objectbox::tsdemo::SensorValues,std::default_delete<objectbox::tsdemo::SensorValues>>>>
    ::emplace_back<objectbox::tsdemo::SensorValues*>
              ((vector<std::unique_ptr<objectbox::tsdemo::SensorValues,std::default_delete<objectbox::tsdemo::SensorValues>>,std::allocator<std::unique_ptr<objectbox::tsdemo::SensorValues,std::default_delete<objectbox::tsdemo::SensorValues>>>>
                *)userData,(SensorValues **)&ptrRef);
    this = std::
           vector<std::unique_ptr<objectbox::tsdemo::SensorValues,_std::default_delete<objectbox::tsdemo::SensorValues>_>,_std::allocator<std::unique_ptr<objectbox::tsdemo::SensorValues,_std::default_delete<objectbox::tsdemo::SensorValues>_>_>_>
           ::back(local_28);
    data_00 = size_local;
    pvVar1 = userData_local;
    outObject = std::
                unique_ptr<objectbox::tsdemo::SensorValues,_std::default_delete<objectbox::tsdemo::SensorValues>_>
                ::operator*(this);
    objectbox::tsdemo::SensorValues::_OBX_MetaInfo::fromFlatBuffer
              ((void *)data_00,(size_t)pvVar1,outObject);
    return true;
  }
  __assert_fail("self",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/objectbox[P]objectbox-ts-demo/build_O0/_deps/objectbox-download-src/include/objectbox.hpp"
                ,0x449,
                "static bool obx::(anonymous namespace)::CollectingVisitorUniquePtr<objectbox::tsdemo::SensorValues>::visit(const void *, size_t, void *) [EntityT = objectbox::tsdemo::SensorValues]"
               );
}

Assistant:

static bool visit(const void* data, size_t size, void* userData) {
        CollectingVisitorUniquePtr<EntityT>* self = static_cast<CollectingVisitorUniquePtr<EntityT>*>(userData);
        assert(self);
        self->items.emplace_back(new EntityT());
        std::unique_ptr<EntityT>& ptrRef = self->items.back();
        EntityT::_OBX_MetaInfo::fromFlatBuffer(data, size, *ptrRef);
        return true;
    }